

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_seg_t * ps_astar_seg_next(ps_seg_t *seg)

{
  int iVar1;
  astar_seg_t *itor;
  
  iVar1 = *(int *)((long)&seg[1].search + 4) + 1;
  *(int *)((long)&seg[1].search + 4) = iVar1;
  if (iVar1 == *(int *)&seg[1].search) {
    ckd_free(seg[1].vt);
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    ps_astar_node2itor((astar_seg_t *)seg);
  }
  return seg;
}

Assistant:

static ps_seg_t *
ps_astar_seg_next(ps_seg_t *seg)
{
    astar_seg_t *itor = (astar_seg_t *)seg;

    ++itor->cur;
    if (itor->cur == itor->n_nodes) {
        ps_astar_seg_free(seg);
        return NULL;
    }
    else {
        ps_astar_node2itor(itor);
    }

    return seg;
}